

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void hermite_gk22_set(int n,double *x,double *w)

{
  if (n == 0x29) {
    *x = -7.251792998192644;
    x[1] = -6.54708325839754;
    x[2] = -5.9614610434045;
    x[3] = -5.437443360177798;
    x[4] = -4.95357434291298;
    x[5] = -4.499599398310388;
    x[6] = -4.070919267883068;
    x[7] = -3.667774215946338;
    x[8] = -3.296114596212218;
    x[9] = -2.959210779063838;
    x[10] = -2.630415236459871;
    x[0xb] = -2.2665132620567876;
    x[0xc] = -2.043834754429505;
    x[0xd] = -2.0232301911005157;
    x[0xe] = -1.8357079751751868;
    x[0xf] = -1.585873011819188;
    x[0x10] = -1.224744871391589;
    x[0x11] = -0.8700408953529029;
    x[0x12] = -0.5240335474869576;
    x[0x13] = -0.195324784415805;
    x[0x14] = 0.0;
    x[0x15] = 0.195324784415805;
    x[0x16] = 0.5240335474869576;
    x[0x17] = 0.8700408953529029;
    x[0x18] = 1.224744871391589;
    x[0x19] = 1.585873011819188;
    x[0x1a] = 1.8357079751751868;
    x[0x1b] = 2.0232301911005157;
    x[0x1c] = 2.043834754429505;
    x[0x1d] = 2.2665132620567876;
    x[0x1e] = 2.630415236459871;
    x[0x1f] = 2.959210779063838;
    x[0x20] = 3.296114596212218;
    x[0x21] = 3.667774215946338;
    x[0x22] = 4.070919267883068;
    x[0x23] = 4.499599398310388;
    x[0x24] = 4.95357434291298;
    x[0x25] = 5.437443360177798;
    x[0x26] = 5.9614610434045;
    x[0x27] = 6.54708325839754;
    x[0x28] = 7.251792998192644;
    *w = 6.641958938127579e-24;
    w[1] = 8.604271725122073e-20;
    w[2] = 1.140700785308509e-16;
    w[3] = 4.08820161202506e-14;
    w[4] = 5.818033931703204e-12;
    w[5] = 4.0078414160483474e-10;
    w[6] = 1.491582104178314e-08;
    w[7] = 3.1537226585226487e-07;
    w[8] = 3.811827917491775e-06;
    w[9] = 2.8897678027447868e-05;
    w[10] = 0.00018901090980509789;
    w[0xb] = 0.0014069742406524683;
    w[0xc] = -0.014452842220698824;
    w[0xd] = 0.017885254303369975;
    w[0xe] = 0.0007054711101229627;
    w[0xf] = 0.016544552670586077;
    w[0x10] = 0.04510901033585913;
    w[0x11] = 0.09283382285101119;
    w[0x12] = 0.14596629389592644;
    w[0x13] = 0.16563974040052956;
    w[0x14] = 0.05627934260432189;
    w[0x15] = 0.16563974040052956;
    w[0x16] = 0.14596629389592644;
    w[0x17] = 0.09283382285101119;
    w[0x18] = 0.04510901033585913;
    w[0x19] = 0.016544552670586077;
    w[0x1a] = 0.0007054711101229627;
    w[0x1b] = 0.017885254303369975;
    w[0x1c] = -0.014452842220698824;
    w[0x1d] = 0.0014069742406524683;
    w[0x1e] = 0.00018901090980509789;
    w[0x1f] = 2.8897678027447868e-05;
    w[0x20] = 3.811827917491775e-06;
    w[0x21] = 3.1537226585226487e-07;
    w[0x22] = 1.491582104178314e-08;
    w[0x23] = 4.0078414160483474e-10;
    w[0x24] = 5.818033931703204e-12;
    w[0x25] = 4.08820161202506e-14;
    w[0x26] = 1.140700785308509e-16;
    w[0x27] = 8.604271725122073e-20;
    w[0x28] = 6.641958938127579e-24;
  }
  else if (n == 3) {
    *x = -1.224744871391589;
    x[1] = 0.0;
    x[2] = 1.224744871391589;
    *w = 0.2954089751509193;
    w[1] = 1.1816359006036772;
    w[2] = 0.2954089751509193;
  }
  else if (n == 9) {
    *x = -2.959210779063838;
    x[1] = -2.0232301911005157;
    x[2] = -1.224744871391589;
    x[3] = -0.5240335474869576;
    x[4] = 0.0;
    x[5] = 0.5240335474869576;
    x[6] = 1.224744871391589;
    x[7] = 2.0232301911005157;
    x[8] = 2.959210779063838;
    *w = 0.00016708826306882348;
    w[1] = 0.014173117873979098;
    w[2] = 0.16811892894767771;
    w[3] = 0.47869428549114124;
    w[4] = 0.45014700975378197;
    w[5] = 0.47869428549114124;
    w[6] = 0.16811892894767771;
    w[7] = 0.014173117873979098;
    w[8] = 0.00016708826306882348;
  }
  else if (n == 0x13) {
    *x = -4.499599398310388;
    x[1] = -3.667774215946338;
    x[2] = -2.959210779063838;
    x[3] = -2.2665132620567876;
    x[4] = -2.0232301911005157;
    x[5] = -1.8357079751751868;
    x[6] = -1.224744871391589;
    x[7] = -0.8700408953529029;
    x[8] = -0.5240335474869576;
    x[9] = 0.0;
    x[10] = 0.5240335474869576;
    x[0xb] = 0.8700408953529029;
    x[0xc] = 1.224744871391589;
    x[0xd] = 1.8357079751751868;
    x[0xe] = 2.0232301911005157;
    x[0xf] = 2.2665132620567876;
    x[0x10] = 2.959210779063838;
    x[0x11] = 3.667774215946338;
    x[0x12] = 4.499599398310388;
    *w = 1.5295717705322357e-09;
    w[1] = 1.0802767206624762e-06;
    w[2] = 0.00010656589772852267;
    w[3] = 0.0051133174390883855;
    w[4] = -0.011232438489069229;
    w[5] = 0.03205524309944588;
    w[6] = 0.11360729895748269;
    w[7] = 0.10838861955003017;
    w[8] = 0.3692464336892085;
    w[9] = 0.5378816070051017;
    w[10] = 0.3692464336892085;
    w[0xb] = 0.10838861955003017;
    w[0xc] = 0.11360729895748269;
    w[0xd] = 0.03205524309944588;
    w[0xe] = -0.011232438489069229;
    w[0xf] = 0.0051133174390883855;
    w[0x10] = 0.00010656589772852267;
    w[0x11] = 1.0802767206624762e-06;
    w[0x12] = 1.5295717705322357e-09;
  }
  else {
    if (n != 1) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"HERMITE_GK22_SET - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  Illegal input value of N.\n");
      std::operator<<((ostream *)&std::cerr,"  N must be 1, 3, 9, 19, or 41.\n");
      exit(1);
    }
    *x = 0.0;
    *w = 1.7724538509055159;
  }
  return;
}

Assistant:

void hermite_gk22_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_GK22_SET sets a Hermite Genz-Keister 22 rule.
//
//  Discussion:
//
//    The integral:
//
//      integral ( -oo <= x <= +oo ) f(x) exp ( - x * x ) dx
//
//    The quadrature rule:
//
//      sum ( 1 <= i <= n ) w(i) * f ( x(i) )
//
//    A nested family of rules for the Hermite integration problem
//    was produced by Genz and Keister.  The structure of the nested
//    family was denoted by 1+2+6+10+16, that is, it comprised rules 
//    of successive orders O = 1, 3, 9, 19, and 41.
//
//    The precisions of these rules are P = 1, 5, 15, 29, and 63.
//
//    Some of the data in this function was kindly supplied directly by
//    Alan Genz on 24 April 2011.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    26 April 2011
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Alan Genz, Bradley Keister,
//    Fully symmetric interpolatory rules for multiple integrals
//    over infinite regions with Gaussian weight,
//    Journal of Computational and Applied Mathematics,
//    Volume 71, 1996, pages 299-309
//
//    Thomas Patterson,
//    The Optimal Addition of Points to Quadrature Formulae,
//    Mathematics of Computation,
//    Volume 22, Number 104, October 1968, pages 847-856.
//
//  Parameters:
//
//    Input, int N, the order.
//    N must be 1, 3, 9, 19, or 41.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  if ( n == 1 )
  {
    x[ 0] =   0.0000000000000000E+00;

    w[ 0] =   1.7724538509055159E+00;
  }
  else if ( n == 3 )
  {
    x[ 0] =  -1.2247448713915889E+00;
    x[ 1] =   0.0000000000000000E+00;
    x[ 2] =   1.2247448713915889E+00;

    w[ 0] =   2.9540897515091930E-01;
    w[ 1] =   1.1816359006036772E+00;
    w[ 2] =   2.9540897515091930E-01;
  }
  else if ( n == 9 )
  {
    x[ 0] =  -2.9592107790638380E+00;
    x[ 1] =  -2.0232301911005157E+00;
    x[ 2] =  -1.2247448713915889E+00;
    x[ 3] =  -5.2403354748695763E-01;
    x[ 4] =   0.0000000000000000E+00;
    x[ 5] =   5.2403354748695763E-01;
    x[ 6] =   1.2247448713915889E+00;
    x[ 7] =   2.0232301911005157E+00;
    x[ 8] =   2.9592107790638380E+00;

    w[ 0] =   1.6708826306882348E-04;
    w[ 1] =   1.4173117873979098E-02;
    w[ 2] =   1.6811892894767771E-01;
    w[ 3] =   4.7869428549114124E-01;
    w[ 4] =   4.5014700975378197E-01;
    w[ 5] =   4.7869428549114124E-01;
    w[ 6] =   1.6811892894767771E-01;
    w[ 7] =   1.4173117873979098E-02;
    w[ 8] =   1.6708826306882348E-04;
  }
  else if ( n == 19 )
  {
    x[ 0] =  -4.4995993983103881E+00;
    x[ 1] =  -3.6677742159463378E+00;
    x[ 2] =  -2.9592107790638380E+00;
    x[ 3] =  -2.2665132620567876E+00;
    x[ 4] =  -2.0232301911005157E+00;
    x[ 5] =  -1.8357079751751868E+00;
    x[ 6] =  -1.2247448713915889E+00;
    x[ 7] =  -8.7004089535290285E-01;
    x[ 8] =  -5.2403354748695763E-01;
    x[ 9] =   0.0000000000000000E+00;
    x[10] =   5.2403354748695763E-01;
    x[11] =   8.7004089535290285E-01;
    x[12] =   1.2247448713915889E+00;
    x[13] =   1.8357079751751868E+00;
    x[14] =   2.0232301911005157E+00;
    x[15] =   2.2665132620567876E+00;
    x[16] =   2.9592107790638380E+00;
    x[17] =   3.6677742159463378E+00;
    x[18] =   4.4995993983103881E+00;

    w[ 0] =   1.5295717705322357E-09;
    w[ 1] =   1.0802767206624762E-06;
    w[ 2] =   1.0656589772852267E-04;
    w[ 3] =   5.1133174390883855E-03;
    w[ 4] =  -1.1232438489069229E-02;
    w[ 5] =   3.2055243099445879E-02;
    w[ 6] =   1.1360729895748269E-01;
    w[ 7] =   1.0838861955003017E-01;
    w[ 8] =   3.6924643368920851E-01;
    w[ 9] =   5.3788160700510168E-01;
    w[10] =   3.6924643368920851E-01;
    w[11] =   1.0838861955003017E-01;
    w[12] =   1.1360729895748269E-01;
    w[13] =   3.2055243099445879E-02;
    w[14] =  -1.1232438489069229E-02;
    w[15] =   5.1133174390883855E-03;
    w[16] =   1.0656589772852267E-04;
    w[17] =   1.0802767206624762E-06;
    w[18] =   1.5295717705322357E-09;
  }
  else if ( n == 41 )
  {
    x[ 0] =  -7.251792998192644;
    x[ 1] =  -6.547083258397540;
    x[ 2] =  -5.961461043404500;
    x[ 3] =  -5.437443360177798;
    x[ 4] =  -4.953574342912980;
    x[ 5] =  -4.4995993983103881;
    x[ 6] =  -4.070919267883068;
    x[ 7] =  -3.6677742159463378;
    x[ 8] =  -3.296114596212218;
    x[ 9] =  -2.9592107790638380;
    x[10] =  -2.630415236459871;
    x[11] =  -2.2665132620567876;
    x[12] =  -2.043834754429505;
    x[13] =  -2.0232301911005157;
    x[14] =  -1.8357079751751868;
    x[15] =  -1.585873011819188;
    x[16] =  -1.2247448713915889;
    x[17] =  -0.87004089535290285;
    x[18] =  -0.52403354748695763;
    x[19] =  -0.195324784415805;
    x[20] =   0.0000000000000000;
    x[21] =   0.195324784415805;
    x[22] =   0.52403354748695763;
    x[23] =   0.87004089535290285;
    x[24] =   1.2247448713915889;
    x[25] =   1.585873011819188;
    x[26] =   1.8357079751751868;
    x[27] =   2.0232301911005157;
    x[28] =   2.043834754429505;
    x[29] =   2.2665132620567876;
    x[30] =   2.630415236459871;
    x[31] =   2.9592107790638380;
    x[32] =   3.296114596212218;
    x[33] =   3.6677742159463378;
    x[34] =   4.070919267883068;
    x[35] =   4.4995993983103881;
    x[36] =   4.953574342912980;
    x[37] =   5.437443360177798;
    x[38] =   5.961461043404500;
    x[39] =   6.547083258397540;
    x[40] =   7.251792998192644;

    w[ 0] =   0.664195893812757801E-23;
    w[ 1] =   0.860427172512207236E-19;
    w[ 2] =   0.1140700785308509E-15;
    w[ 3] =   0.408820161202505983E-13;
    w[ 4] =   0.581803393170320419E-11;
    w[ 5] =   0.400784141604834759E-09;
    w[ 6] =   0.149158210417831408E-07;
    w[ 7] =   0.315372265852264871E-06;
    w[ 8] =   0.381182791749177506E-05;
    w[ 9] =   0.288976780274478689E-04;
    w[10] =   0.189010909805097887E-03;
    w[11] =   0.140697424065246825E-02;
    w[12] = - 0.144528422206988237E-01;
    w[13] =   0.178852543033699732E-01;
    w[14] =   0.705471110122962612E-03;
    w[15] =   0.165445526705860772E-01;
    w[16] =   0.45109010335859128E-01;
    w[17] =   0.928338228510111845E-01;
    w[18] =   0.145966293895926429E+00;
    w[19] =   0.165639740400529554E+00;
    w[20] =   0.562793426043218877E-01;
    w[21] =   0.165639740400529554E+00;
    w[22] =   0.145966293895926429E+00;
    w[23] =   0.928338228510111845E-01;
    w[24] =   0.45109010335859128E-01;
    w[25] =   0.165445526705860772E-01;
    w[26] =   0.705471110122962612E-03;
    w[27] =   0.178852543033699732E-01;
    w[28] = - 0.144528422206988237E-01;
    w[29] =   0.140697424065246825E-02;
    w[30] =   0.189010909805097887E-03;
    w[31] =   0.288976780274478689E-04;
    w[32] =   0.381182791749177506E-05;
    w[33] =   0.315372265852264871E-06;
    w[34] =   0.149158210417831408E-07;
    w[35] =   0.400784141604834759E-09;
    w[36] =   0.581803393170320419E-11;
    w[37] =   0.408820161202505983E-13;
    w[38] =   0.1140700785308509E-15;
    w[39] =   0.860427172512207236E-19;
    w[40] =   0.664195893812757801E-23;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "HERMITE_GK22_SET - Fatal error!\n";
    std::cerr << "  Illegal input value of N.\n";
    std::cerr << "  N must be 1, 3, 9, 19, or 41.\n";
    exit ( 1 );
  }
  return;
}